

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_DefineAutoInitProperty
              (JSContext *ctx,JSValue this_obj,JSAtom prop,JSAutoInitIDEnum id,void *opaque,
              int flags)

{
  JSObject **ppJVar1;
  JSShape *pJVar2;
  int iVar3;
  JSProperty *pJVar4;
  uint uVar5;
  
  iVar3 = 0;
  if ((int)this_obj.tag == -1) {
    pJVar2 = *(JSShape **)((long)this_obj.u.ptr + 0x18);
    uVar5 = (&(pJVar2->header).ref_count)[~(ulong)(pJVar2->prop_hash_mask & prop)];
    while (uVar5 != 0) {
      ppJVar1 = &pJVar2->proto + uVar5;
      if (*(uint *)((long)ppJVar1 + 4) == prop) {
        if (ppJVar1 != (JSObject **)0x0) {
          abort();
        }
        break;
      }
      uVar5 = *(uint *)ppJVar1 & 0x3ffffff;
    }
    pJVar4 = add_property(ctx,(JSObject *)this_obj.u.ptr,prop,flags & 7U | 0x30);
    if (pJVar4 == (JSProperty *)0x0) {
      iVar3 = -1;
    }
    else {
      (ctx->header).ref_count = (ctx->header).ref_count + 1;
      (pJVar4->u).init.realm_and_id = (ulong)id | (ulong)ctx;
      (pJVar4->u).init.opaque = opaque;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int JS_DefineAutoInitProperty(JSContext *ctx, JSValueConst this_obj,
                                     JSAtom prop, JSAutoInitIDEnum id,
                                     void *opaque, int flags)
{
    JSObject *p;
    JSProperty *pr;

    if (JS_VALUE_GET_TAG(this_obj) != JS_TAG_OBJECT)
        return FALSE;

    p = JS_VALUE_GET_OBJ(this_obj);

    if (find_own_property(&pr, p, prop)) {
        /* property already exists */
        abort();
        return FALSE;
    }

    /* Specialized CreateProperty */
    pr = add_property(ctx, p, prop, (flags & JS_PROP_C_W_E) | JS_PROP_AUTOINIT);
    if (unlikely(!pr))
        return -1;
    pr->u.init.realm_and_id = (uintptr_t)JS_DupContext(ctx);
    assert((pr->u.init.realm_and_id & 3) == 0);
    assert(id <= 3);
    pr->u.init.realm_and_id |= id;
    pr->u.init.opaque = opaque;
    return TRUE;
}